

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::parseScaleOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  int32_t textLength;
  UErrorCode UVar1;
  UObject this;
  UnicodeString *s;
  DecNum *p;
  StringPiece str;
  UErrorCode conversionStatus;
  CharString buffer;
  UErrorCode local_fc;
  ConstChar16Ptr local_f8;
  char16_t *local_f0;
  UnicodeString local_e0;
  UnicodeString local_a0;
  CharString local_60;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_60.buffer);
  local_60.len = 0;
  *(undefined1 *)&(((Replaceable *)local_60.buffer.ptr)->super_UObject)._vptr_UObject = 0;
  local_fc = U_ZERO_ERROR;
  numparse::impl::StringSegment::toTempUnicodeString(&local_e0,segment);
  if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_e0.fUnion.fFields.fArray = (char16_t *)((long)&local_e0.fUnion + 2);
    }
  }
  else {
    local_e0.fUnion.fFields.fArray = (char16_t *)0x0;
  }
  local_f8.p_ = local_e0.fUnion.fFields.fArray;
  textLength = numparse::impl::StringSegment::length(segment);
  icu_63::UnicodeString::UnicodeString(&local_a0,'\0',&local_f8,textLength);
  s = &local_a0;
  CharString::appendInvariantChars(&local_60,s,&local_fc);
  icu_63::UnicodeString::~UnicodeString(&local_a0);
  local_f0 = local_f8.p_;
  icu_63::UnicodeString::~UnicodeString(&local_e0);
  UVar1 = U_NUMBER_SKELETON_SYNTAX_ERROR;
  if ((local_fc == U_INVARIANT_CONVERSION_ERROR) || (UVar1 = local_fc, U_ZERO_ERROR < local_fc)) {
    *status = UVar1;
    goto LAB_002af0bb;
  }
  this._vptr_UObject = (_func_int **)UMemory::operator_new((UMemory *)0x60,(size_t)s);
  if ((DecNum *)this._vptr_UObject == (DecNum *)0x0) {
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
LAB_002af173:
    this._vptr_UObject = (_func_int **)0x0;
  }
  else {
    DecNum::DecNum((DecNum *)this._vptr_UObject);
    local_e0.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)this._vptr_UObject;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      str.length_ = local_60.len;
      str.ptr_ = local_60.buffer.ptr;
      str._12_4_ = 0;
      DecNum::setTo((DecNum *)this._vptr_UObject,str,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_e0.super_Replaceable.super_UObject._vptr_UObject = (UObject)(_func_int **)0x0;
        Scale::Scale((Scale *)&local_a0,0,(DecNum *)this._vptr_UObject);
        s = &local_a0;
        Scale::operator=(&macros->scale,(Scale *)&local_a0);
        Scale::~Scale((Scale *)&local_a0);
        goto LAB_002af173;
      }
      *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
      s = (UnicodeString *)local_60.buffer.ptr;
    }
    MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray
              ((MaybeStackHeaderAndArray<decNumber,_char,_34> *)this._vptr_UObject);
  }
  UMemory::operator_delete((UMemory *)this._vptr_UObject,s);
LAB_002af0bb:
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_60.buffer);
  return;
}

Assistant:

void blueprint_helpers::parseScaleOption(const StringSegment& segment, MacroProps& macros,
                                              UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    LocalPointer<DecNum> decnum(new DecNum(), status);
    if (U_FAILURE(status)) { return; }
    decnum->setTo({buffer.data(), buffer.length()}, status);
    if (U_FAILURE(status)) {
        // This is a skeleton syntax error; don't let the low-level decnum error bubble up
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }

    // NOTE: The constructor will optimize the decnum for us if possible.
    macros.scale = {0, decnum.orphan()};
}